

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
::internal_clear(btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                 *this,node_type *node)

{
  bool bVar1;
  byte bVar2;
  template_ElementType<3UL> *ppbVar3;
  int i;
  ulong uVar4;
  
  bVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
          ::leaf(node);
  if (bVar1) {
    delete_leaf_node(this,node);
    return;
  }
  uVar4 = 0;
  while( true ) {
    bVar2 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
            ::count(node);
    if (bVar2 < uVar4) break;
    ppbVar3 = btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
              ::GetField<3ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
                               *)node);
    internal_clear(this,ppbVar3[uVar4]);
    uVar4 = uVar4 + 1;
  }
  delete_internal_node(this,node);
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }